

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O0

void __thiscall nonstd::thread_pool::thread_pool(thread_pool *this,int n)

{
  int n_local;
  thread_pool *this_local;
  
  std::mutex::mutex(&this->m);
  std::condition_variable::condition_variable(&this->cond);
  std::vector<std::thread_*,_std::allocator<std::thread_*>_>::vector(&this->thread_list);
  std::
  queue<nonstd::thread_pool::job_info*,std::deque<nonstd::thread_pool::job_info*,std::allocator<nonstd::thread_pool::job_info*>>>
  ::
  queue<std::deque<nonstd::thread_pool::job_info*,std::allocator<nonstd::thread_pool::job_info*>>,void>
            ((queue<nonstd::thread_pool::job_info*,std::deque<nonstd::thread_pool::job_info*,std::allocator<nonstd::thread_pool::job_info*>>>
              *)&this->jobs);
  this->terminate = false;
  this->MAX_THREADS = n;
  if (this->MAX_THREADS < 1) {
    this->MAX_THREADS = 1;
  }
  return;
}

Assistant:

thread_pool::thread_pool(int n):MAX_THREADS(n)
    {
        if (MAX_THREADS <= 0) MAX_THREADS = 1;
    }